

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasParamTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasParamTestInstance>
               *this,Context *context)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  char *vertexShaderName;
  StencilOpState _front;
  StencilOpState _back;
  DepthBiasBaseCase *this_01;
  mapped_type *ppcVar1;
  long lVar2;
  undefined8 *puVar3;
  DepthStencilState *pDVar4;
  byte bVar5;
  StencilOpState local_f0;
  StencilOpState local_d0;
  undefined1 local_b0 [8];
  void *pvStack_a8;
  float local_a0 [22];
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_48;
  
  bVar5 = 0;
  this_01 = (DepthBiasBaseCase *)operator_new(0x248);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_48,&(this->m_shaderPaths)._M_t);
  local_b0 = (undefined1  [8])((ulong)(uint)local_b0._4_4_ << 0x20);
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_48,(key_type *)local_b0);
  vertexShaderName = *ppcVar1;
  local_f0.super_VkStencilOpState.failOp = VK_STENCIL_OP_ZERO;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_48,(key_type *)&local_f0);
  DynamicState::anon_unknown_0::DepthBiasBaseCase::DepthBiasBaseCase
            (this_01,context,vertexShaderName,*ppcVar1);
  (this_01->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__DepthBiasBaseCase_00d29bb8;
  local_d0.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  this_00 = &this_01->m_data;
  local_b0 = (undefined1  [8])0x3f800000bf800000;
  pvStack_a8 = (void *)0x3f8000003f000000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0x3f8000003f800000;
  pvStack_a8 = (void *)0x3f8000003f000000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0xbf800000bf800000;
  pvStack_a8 = (void *)0x3f8000003f000000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0xbf8000003f800000;
  pvStack_a8 = (void *)0x3f8000003f000000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0x3f000000bf000000;
  pvStack_a8 = (void *)0x3f8000003f800000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0x3f0000003f000000;
  pvStack_a8 = (void *)0x3f8000003f800000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0xbf000000bf000000;
  pvStack_a8 = (void *)0x3f8000003f800000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0xbf0000003f000000;
  pvStack_a8 = (void *)0x3f8000003f800000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0x3f800000bf800000;
  pvStack_a8 = (void *)0x3f8000003f000000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0x3f8000003f800000;
  pvStack_a8 = (void *)0x3f8000003f000000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0xbf800000bf800000;
  pvStack_a8 = (void *)0x3f8000003f000000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  local_d0.super_VkStencilOpState.failOp = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)&local_f0);
  local_b0 = (undefined1  [8])0xbf8000003f800000;
  pvStack_a8 = (void *)0x3f8000003f000000;
  local_a0[1] = (float)local_f0.super_VkStencilOpState.passOp;
  local_a0[0] = (float)local_f0.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_b0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&local_f0,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&local_d0,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _back.super_VkStencilOpState.passOp = local_d0.super_VkStencilOpState.passOp;
  _back.super_VkStencilOpState.failOp = local_d0.super_VkStencilOpState.failOp;
  _front.super_VkStencilOpState.passOp = local_f0.super_VkStencilOpState.passOp;
  _front.super_VkStencilOpState.failOp = local_f0.super_VkStencilOpState.failOp;
  _front.super_VkStencilOpState.depthFailOp = local_f0.super_VkStencilOpState.depthFailOp;
  _front.super_VkStencilOpState.compareOp = local_f0.super_VkStencilOpState.compareOp;
  _front.super_VkStencilOpState.compareMask = local_f0.super_VkStencilOpState.compareMask;
  _front.super_VkStencilOpState.writeMask = local_f0.super_VkStencilOpState.writeMask;
  _front.super_VkStencilOpState.reference = local_f0.super_VkStencilOpState.reference;
  _back.super_VkStencilOpState.depthFailOp = local_d0.super_VkStencilOpState.depthFailOp;
  _back.super_VkStencilOpState.compareOp = local_d0.super_VkStencilOpState.compareOp;
  _back.super_VkStencilOpState.compareMask = local_d0.super_VkStencilOpState.compareMask;
  _back.super_VkStencilOpState.writeMask = local_d0.super_VkStencilOpState.writeMask;
  _back.super_VkStencilOpState.reference = local_d0.super_VkStencilOpState.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)local_b0,1,1,VK_COMPARE_OP_GREATER_OR_EQUAL,0,0,_front,_back,0.0,
             1.0);
  puVar3 = (undefined8 *)local_b0;
  pDVar4 = &this_01->m_depthStencilState;
  for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)&pDVar4->super_VkPipelineDepthStencilStateCreateInfo = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pDVar4 = (DepthStencilState *)((long)pDVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  DynamicState::anon_unknown_0::DepthBiasBaseCase::initialize(this_01);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_48);
  return &this_01->super_TestInstance;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}